

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O2

uint32_t __thiscall
cppnet::BufferQueue::Read(BufferQueue *this,shared_ptr<cppnet::InnerBuffer> *buffer,uint32_t len)

{
  element_type *peVar1;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar2;
  uint uVar3;
  _func_int **pp_Var4;
  uint32_t uVar5;
  bool bVar6;
  shared_ptr<cppnet::BufferQueue> buffer_queue;
  shared_ptr<cppnet::BufferBlock> buffer_read;
  shared_ptr<cppnet::InnerBuffer> local_a0;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_90;
  BufferQueue *local_80;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *local_78;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *local_60;
  List<cppnet::BufferBlock> *local_58;
  __shared_ptr<cppnet::InnerBuffer,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  uVar5 = 0;
  if ((buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    if ((len == 0) &&
       (len = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[8])(this), len == 0)) {
      return 0;
    }
    std::dynamic_pointer_cast<cppnet::BufferQueue,cppnet::InnerBuffer>(&local_a0);
    pp_Var4 = local_a0.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr[7]
              .super_Buffer._vptr_Buffer;
    if (pp_Var4 == (_func_int **)0x0) {
      (*((local_a0.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Buffer)._vptr_Buffer[0x13])
                (local_a0.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,
                 (__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_a0.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 5));
      std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_a0.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 7),&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      pp_Var4 = local_a0.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                [7].super_Buffer._vptr_Buffer;
    }
    uVar2 = (**(code **)(*pp_Var4 + 0x58))();
    local_58 = &this->_buffer_list;
    local_60 = &(this->_buffer_list)._head.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_90,local_60);
    local_78 = &(this->_buffer_write).
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>;
    uVar5 = 0;
    local_80 = this;
    do {
      peVar1 = local_90._M_ptr;
      if (local_90._M_ptr == (element_type *)0x0) break;
      std::__shared_ptr<cppnet::InnerBuffer,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cppnet::BufferBlock,void>
                (local_50,(__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *)
                          (local_a0.
                           super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7));
      uVar3 = (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[0xc])
                        (peVar1,local_50,(ulong)uVar2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
      uVar5 = uVar5 + uVar3;
      bVar6 = uVar2 < uVar3;
      uVar2 = uVar2 - uVar3;
      if (bVar6 || uVar2 == 0) {
        if (len <= uVar5) break;
        (*((local_a0.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_Buffer)._vptr_Buffer[0x13])();
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_70,
                   (__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *)
                   (local_a0.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 5));
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *)
                   (local_a0.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 7),&local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
        uVar2 = (**(code **)(*local_a0.
                              super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr[7].super_Buffer._vptr_Buffer + 0x58))();
      }
      else {
        peVar1 = ((__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2> *)&local_78->_M_ptr
                 )->_M_ptr;
        if (local_90._M_ptr == peVar1) {
          std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_70,
                     &(peVar1->super_ListSlot<cppnet::BufferBlock>)._next.
                      super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
          peVar1 = local_70._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
          this_00 = local_78;
          if (peVar1 == (element_type *)0x0) {
            (*(local_80->super_InnerBuffer).super_Buffer._vptr_Buffer[0x12])();
            break;
          }
          std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_70,
                     &(local_78->_M_ptr->super_ListSlot<cppnet::BufferBlock>)._next.
                      super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
          std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (this_00,&local_70);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
        }
        List<cppnet::BufferBlock>::PopFront((List<cppnet::BufferBlock> *)(local_48 + 1));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_70,local_60);
        std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_90,&local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      }
    } while (uVar5 < len);
    local_80->_can_read_length = local_80->_can_read_length - uVar5;
    *(uint32_t *)
     &local_a0.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
      super_Buffer._vptr_Buffer =
         *(int *)&local_a0.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr[1].super_Buffer._vptr_Buffer + uVar5;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a0.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return uVar5;
}

Assistant:

uint32_t BufferQueue::Read(std::shared_ptr<InnerBuffer> buffer, uint32_t len) {
    if (!buffer) {
        return 0;
    }
    
    if (len == 0) {
        len = GetCanReadLength();
    } 
    if (len == 0) {
        return 0;
    }

    std::shared_ptr<BufferQueue> buffer_queue = std::dynamic_pointer_cast<BufferQueue>(buffer);
    if (!buffer_queue->_buffer_write) {
        buffer_queue->Append();
        buffer_queue->_buffer_write = buffer_queue->_buffer_list.GetTail();
    }

    uint32_t can_write_size = buffer_queue->_buffer_write->GetCanWriteLength();
    uint32_t total_read_len = 0;
    uint32_t cur_read_len = 0;

    auto buffer_read = _buffer_list.GetHead();
    while (buffer_read) {
        cur_read_len = buffer_read->Read(buffer_queue->_buffer_write, can_write_size);
        total_read_len += cur_read_len;

        // current write block is full
        if (cur_read_len >= can_write_size) {
            if (total_read_len >= len) {
                break;
            }

            buffer_queue->Append();
            buffer_queue->_buffer_write = buffer_queue->_buffer_list.GetTail();
            can_write_size = buffer_queue->_buffer_write->GetCanWriteLength();

        // current read block is empty
        } else {
            can_write_size -= cur_read_len;
            if (buffer_read == _buffer_write) {
                if (_buffer_write->GetNext()) {
                    _buffer_write = _buffer_write->GetNext();

                } else {
                    Reset();
                    break;
                }
            }
            _buffer_list.PopFront();
            buffer_read = _buffer_list.GetHead();
        }

        if (total_read_len >= len) {
            break;
        }
    }
    _can_read_length -= total_read_len;
    buffer_queue->_can_read_length += total_read_len;
    return total_read_len;
}